

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O2

void __thiscall QWizard::QWizard(QWizard *this,QWidget *parent,WindowFlags flags)

{
  QWizardPrivate *this_00;
  
  this_00 = (QWizardPrivate *)operator_new(0x4e0);
  QWizardPrivate::QWizardPrivate(this_00);
  QDialog::QDialog(&this->super_QDialog,(QDialogPrivate *)this_00,parent,flags);
  *(undefined ***)&(this->super_QDialog).super_QWidget = &PTR_metaObject_007df708;
  *(undefined ***)&(this->super_QDialog).super_QWidget.super_QPaintDevice = &PTR__QWizard_007df900;
  QWizardPrivate::init
            (*(QWizardPrivate **)&(this->super_QDialog).super_QWidget.field_0x8,
             (EVP_PKEY_CTX *)this_00);
  return;
}

Assistant:

QWizard::QWizard(QWidget *parent, Qt::WindowFlags flags)
    : QDialog(*new QWizardPrivate, parent, flags)
{
    Q_D(QWizard);
    d->init();
}